

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMapping.c
# Opt level: O2

void Mips_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  unsigned_short uVar3;
  uint uVar4;
  cs_detail *pcVar5;
  insn_map *piVar6;
  
  if (alias_insns[0].id == id) {
    piVar6 = alias_insns;
  }
  else {
    if (alias_insns[1].id != id) {
      uVar3 = insn_find(insns,0x5dc,id,&h->insn_cache);
      if (uVar3 == 0) {
        return;
      }
      insn->id = (uint)insns[uVar3].mapid;
      if (h->detail == CS_OPT_OFF) {
        return;
      }
      pcVar5 = insn->detail;
      *(undefined4 *)(pcVar5->regs_read + 8) = *(undefined4 *)(insns[uVar3].regs_use + 8);
      *(undefined8 *)pcVar5->regs_read = *(undefined8 *)insns[uVar3].regs_use;
      uVar4 = count_positive(insns[uVar3].regs_use);
      pcVar5 = insn->detail;
      pcVar5->regs_read_count = (uint8_t)uVar4;
      *(undefined4 *)(pcVar5->regs_write + 0x10) = *(undefined4 *)(insns[uVar3].regs_mod + 0x10);
      uVar2 = *(undefined8 *)(insns[uVar3].regs_mod + 8);
      *(undefined8 *)pcVar5->regs_write = *(undefined8 *)insns[uVar3].regs_mod;
      *(undefined8 *)(pcVar5->regs_write + 8) = uVar2;
      uVar4 = count_positive(insns[uVar3].regs_mod);
      pcVar5 = insn->detail;
      pcVar5->regs_write_count = (uint8_t)uVar4;
      *(undefined8 *)pcVar5->groups = *(undefined8 *)insns[uVar3].groups;
      uVar4 = count_positive(insns[uVar3].groups);
      pcVar5 = insn->detail;
      pcVar5->groups_count = (uint8_t)uVar4;
      if ((insns[uVar3].branch == false) && (insns[uVar3].indirect_branch != true)) {
        return;
      }
      goto LAB_0018b5cf;
    }
    piVar6 = (insn_map *)0x30cfee;
  }
  insn->id = (uint)piVar6->mapid;
  if (h->detail == CS_OPT_OFF) {
    return;
  }
  pcVar5 = insn->detail;
  *(undefined4 *)(pcVar5->regs_read + 8) = *(undefined4 *)(piVar6->regs_use + 8);
  *(undefined8 *)pcVar5->regs_read = *(undefined8 *)piVar6->regs_use;
  uVar4 = count_positive(piVar6->regs_use);
  pcVar5 = insn->detail;
  pcVar5->regs_read_count = (uint8_t)uVar4;
  *(undefined4 *)(pcVar5->regs_write + 0x10) = *(undefined4 *)(piVar6->regs_mod + 0x10);
  uVar2 = *(undefined8 *)(piVar6->regs_mod + 8);
  *(undefined8 *)pcVar5->regs_write = *(undefined8 *)piVar6->regs_mod;
  *(undefined8 *)(pcVar5->regs_write + 8) = uVar2;
  uVar4 = count_positive(piVar6->regs_mod);
  pcVar5 = insn->detail;
  pcVar5->regs_write_count = (uint8_t)uVar4;
  *(undefined8 *)pcVar5->groups = *(undefined8 *)piVar6->groups;
  uVar4 = count_positive(piVar6->groups);
  pcVar5 = insn->detail;
  pcVar5->groups_count = (uint8_t)uVar4;
  if ((piVar6->branch == false) && (piVar6->indirect_branch == false)) {
    return;
  }
LAB_0018b5cf:
  pcVar5->groups[uVar4 & 0xff] = '\x01';
  puVar1 = &insn->detail->groups_count;
  *puVar1 = *puVar1 + '\x01';
  return;
}

Assistant:

void Mips_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	unsigned int i;

	// consider alias insn first
	for (i = 0; i < ARR_SIZE(alias_insns); i++) {
		if (alias_insns[i].id == id) {
			insn->id = alias_insns[i].mapid;

			if (h->detail) {
#ifndef CAPSTONE_DIET
				memcpy(insn->detail->regs_read, alias_insns[i].regs_use, sizeof(alias_insns[i].regs_use));
				insn->detail->regs_read_count = (uint8_t)count_positive(alias_insns[i].regs_use);

				memcpy(insn->detail->regs_write, alias_insns[i].regs_mod, sizeof(alias_insns[i].regs_mod));
				insn->detail->regs_write_count = (uint8_t)count_positive(alias_insns[i].regs_mod);

				memcpy(insn->detail->groups, alias_insns[i].groups, sizeof(alias_insns[i].groups));
				insn->detail->groups_count = (uint8_t)count_positive(alias_insns[i].groups);

				if (alias_insns[i].branch || alias_insns[i].indirect_branch) {
					// this insn also belongs to JUMP group. add JUMP group
					insn->detail->groups[insn->detail->groups_count] = MIPS_GRP_JUMP;
					insn->detail->groups_count++;
				}

#endif
			}
			return;
		}
	}

	i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = MIPS_GRP_JUMP;
				insn->detail->groups_count++;
			}
#endif
		}
	}
}